

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Visit(IsGreaterThanZero *this,SENode *node)

{
  long lVar1;
  int iVar2;
  Signedness SVar3;
  Signedness SVar4;
  uint32_t id;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DefUseManager *this_00;
  Instruction *this_01;
  TypeManager *this_02;
  Type *pTVar5;
  undefined4 extraout_var_03;
  code *pcVar6;
  _Any_data *p_Var7;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  p_Var7 = &local_88;
  iVar2 = (**node->_vptr_SENode)(node);
  SVar4 = kPositiveOrNegative;
  switch(iVar2) {
  case 0:
    iVar2 = (*node->_vptr_SENode[5])(node);
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x30);
    SVar4 = kPositive;
    if (lVar1 != 0) {
      SVar4 = (0 < lVar1) + 1 + (uint)(0 < lVar1);
    }
    break;
  case 1:
    iVar2 = (*node->_vptr_SENode[7])(node);
    SVar4 = Visit(this,*(SENode **)(CONCAT44(extraout_var_01,iVar2) + 0x30));
    if (SVar4 == kStrictlyPositive) {
      SVar4 = kPositive;
    }
    else if (SVar4 == kStrictlyNegative) {
      SVar4 = kNegative;
    }
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_manager;
    SVar3 = Visit(this,*(SENode **)(CONCAT44(extraout_var_01,iVar2) + 0x38));
    SVar4 = std::
            function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
            ::operator()((function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
                          *)&local_48,SVar4,SVar3);
    if (local_38 == (code *)0x0) {
      return SVar4;
    }
    p_Var7 = &local_48;
    pcVar6 = local_38;
    goto LAB_0022a2f5;
  case 2:
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:707:12)>
               ::_M_manager;
    SVar4 = VisitExpr(this,node,
                      (function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
                       *)&local_68);
    if (local_58 == (code *)0x0) {
      return SVar4;
    }
    p_Var7 = &local_68;
    pcVar6 = local_58;
    goto LAB_0022a2f5;
  case 3:
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:743:12)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp:743:12)>
               ::_M_manager;
    SVar4 = VisitExpr(this,node,
                      (function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
                       *)&local_88);
    pcVar6 = local_78;
    if (local_78 == (code *)0x0) {
      return SVar4;
    }
LAB_0022a2f5:
    (*pcVar6)(p_Var7,p_Var7,__destroy_functor);
    break;
  case 4:
    iVar2 = (*node->_vptr_SENode[0xd])(node);
    SVar3 = Visit(this,(SENode *)**(undefined8 **)(CONCAT44(extraout_var_00,iVar2) + 8));
    SVar4 = kPositiveOrNegative;
    if (SVar3 - kStrictlyNegative < 4) {
      SVar4 = *(Signedness *)(&DAT_002e3bd0 + (ulong)(SVar3 - kStrictlyNegative) * 4);
    }
    break;
  case 5:
    iVar2 = (*node->_vptr_SENode[0xf])(node);
    this_00 = IRContext::get_def_use_mgr(this->context_);
    this_01 = analysis::DefUseManager::GetDef
                        (this_00,*(uint32_t *)(CONCAT44(extraout_var_02,iVar2) + 0x2c));
    this_02 = IRContext::get_type_mgr(this->context_);
    id = Instruction::type_id(this_01);
    pTVar5 = analysis::TypeManager::GetType(this_02,id);
    if (pTVar5 == (Type *)0x0) {
      __assert_fail("type && \"Can\'t retrieve a type for the instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,0x34e,
                    "Signedness spvtools::opt::(anonymous namespace)::IsGreaterThanZero::Visit(const SEValueUnknown *)"
                   );
    }
    iVar2 = (*pTVar5->_vptr_Type[9])(pTVar5);
    SVar4 = (*(byte *)(CONCAT44(extraout_var_03,iVar2) + 0x28) ^ 1) << 2;
    break;
  case 6:
    (*node->_vptr_SENode[0x11])(node);
  }
  return SVar4;
}

Assistant:

Signedness Visit(const SENode* node) {
    switch (node->GetType()) {
      case SENode::Constant:
        return Visit(node->AsSEConstantNode());
        break;
      case SENode::RecurrentAddExpr:
        return Visit(node->AsSERecurrentNode());
        break;
      case SENode::Negative:
        return Visit(node->AsSENegative());
        break;
      case SENode::CanNotCompute:
        return Visit(node->AsSECantCompute());
        break;
      case SENode::ValueUnknown:
        return Visit(node->AsSEValueUnknown());
        break;
      case SENode::Add:
        return VisitExpr(node, GetAddCombiner());
        break;
      case SENode::Multiply:
        return VisitExpr(node, GetMulCombiner());
        break;
    }
    return Signedness::kPositiveOrNegative;
  }